

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> *
anon_unknown.dwarf_7f10::expandHrp
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,string *hrp
          )

{
  byte bVar1;
  size_type sVar2;
  size_type i;
  size_type sVar3;
  allocator_type local_19;
  
  sVar2 = hrp->_M_string_length;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,sVar2 * 2 + 1,&local_19);
  for (sVar3 = 0; sVar2 != sVar3; sVar3 = sVar3 + 1) {
    bVar1 = (hrp->_M_dataplus)._M_p[sVar3];
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_start[sVar3] = bVar1 >> 5;
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_start[sVar3 + 1 + sVar2] = bVar1 & 0x1f;
  }
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start[sVar2] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::vector<unsigned char> expandHrp(const std::string & hrp) {
        std::string::size_type sz = hrp.size();
        std::vector<unsigned char> ret(sz * 2 + 1);
        for(std::string::size_type i=0; i < sz; ++i) {
            auto c = static_cast<unsigned char>(hrp[i]);
            ret[i] = c >> 5u;
            ret[i + sz + 1] = c & static_cast<unsigned char>(0x1f);
        }
        ret[sz] = 0;
        return ret;
    }